

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImTriangulator::BuildNodes(ImTriangulator *this,ImVec2 *points,int points_count)

{
  ImTriangulatorNode *pIVar1;
  long lVar2;
  ulong uVar3;
  
  if (points_count < 1) {
    pIVar1 = this->_Nodes;
  }
  else {
    pIVar1 = this->_Nodes;
    lVar2 = 0x20;
    uVar3 = 0;
    do {
      *(undefined4 *)((long)&pIVar1[-1].Type + lVar2) = 0;
      *(int *)((long)pIVar1 + lVar2 + -0x1c) = (int)uVar3;
      *(ImVec2 *)((long)pIVar1 + lVar2 + -0x18) = points[uVar3];
      pIVar1 = this->_Nodes;
      *(long *)((long)pIVar1 + lVar2 + -0x10) = (long)&pIVar1->Type + lVar2;
      *(long *)((long)pIVar1 + lVar2 + -8) = (long)&pIVar1[-2].Type + lVar2;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while ((uint)points_count != uVar3);
  }
  pIVar1->Prev = pIVar1 + (long)points_count + -1;
  pIVar1[(long)points_count + -1].Next = pIVar1;
  return;
}

Assistant:

void ImTriangulator::BuildNodes(const ImVec2* points, int points_count)
{
    for (int i = 0; i < points_count; i++)
    {
        _Nodes[i].Type = ImTriangulatorNodeType_Convex;
        _Nodes[i].Index = i;
        _Nodes[i].Pos = points[i];
        _Nodes[i].Next = _Nodes + i + 1;
        _Nodes[i].Prev = _Nodes + i - 1;
    }
    _Nodes[0].Prev = _Nodes + points_count - 1;
    _Nodes[points_count - 1].Next = _Nodes;
}